

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O0

void __thiscall
draco::OctahedronToolBox::CanonicalizeOctahedralCoords
          (OctahedronToolBox *this,int32_t s,int32_t t,int32_t *out_s,int32_t *out_t)

{
  int32_t *out_t_local;
  int32_t *out_s_local;
  int32_t t_local;
  int32_t s_local;
  OctahedronToolBox *this_local;
  
  if ((((s == 0) && (t == 0)) || ((s == 0 && (t == this->max_value_)))) ||
     ((s == this->max_value_ && (t == 0)))) {
    s_local = this->max_value_;
    t_local = this->max_value_;
  }
  else {
    s_local = s;
    if ((s == 0) && (this->center_value_ < t)) {
      t_local = this->center_value_ - (t - this->center_value_);
    }
    else if ((s == this->max_value_) && (t < this->center_value_)) {
      t_local = this->center_value_ + (this->center_value_ - t);
    }
    else {
      t_local = t;
      if ((t == this->max_value_) && (s < this->center_value_)) {
        s_local = this->center_value_ + (this->center_value_ - s);
      }
      else if ((t == 0) && (this->center_value_ < s)) {
        s_local = this->center_value_ - (s - this->center_value_);
      }
    }
  }
  *out_s = s_local;
  *out_t = t_local;
  return;
}

Assistant:

inline void CanonicalizeOctahedralCoords(int32_t s, int32_t t, int32_t *out_s,
                                           int32_t *out_t) const {
    if ((s == 0 && t == 0) || (s == 0 && t == max_value_) ||
        (s == max_value_ && t == 0)) {
      s = max_value_;
      t = max_value_;
    } else if (s == 0 && t > center_value_) {
      t = center_value_ - (t - center_value_);
    } else if (s == max_value_ && t < center_value_) {
      t = center_value_ + (center_value_ - t);
    } else if (t == max_value_ && s < center_value_) {
      s = center_value_ + (center_value_ - s);
    } else if (t == 0 && s > center_value_) {
      s = center_value_ - (s - center_value_);
    }

    *out_s = s;
    *out_t = t;
  }